

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

civil_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::TimeLocal
          (civil_lookup *__return_storage_ptr__,TimeZoneInfo *this,civil_second *cs,year_t c4_shift)

{
  long lVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  *__lhs;
  bool bVar2;
  year_t yVar3;
  rep rVar4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar5;
  const_iterator pptVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *tp;
  const_iterator __end4;
  const_iterator __begin4;
  time_point<seconds> *local_78;
  time_point<seconds> *local_70;
  initializer_list<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_*>
  local_68;
  initializer_list<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_*>
  *local_58;
  initializer_list<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_*>
  *__range4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  limit;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  seconds offset;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  year_t local_20;
  year_t c4_shift_local;
  civil_second *cs_local;
  TimeZoneInfo *this_local;
  
  lVar1 = this->last_year_;
  local_20 = c4_shift;
  c4_shift_local = (year_t)cs;
  cs_local = (civil_second *)this;
  yVar3 = detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::year(cs);
  bVar2 = false;
  if (lVar1 + -400 < yVar3) {
    yVar3 = detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::year
                      ((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> *)
                       c4_shift_local);
    bVar2 = yVar3 <= this->last_year_;
  }
  if (bVar2) {
    (*(this->super_TimeZoneIf)._vptr_TimeZoneIf[3])(__return_storage_ptr__,this,c4_shift_local);
    yVar3 = local_20;
    local_28 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::max();
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_28);
    if (rVar4 / 0x2f0605980 < yVar3) {
      tVar5 = std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
              ::max();
      (__return_storage_ptr__->post).__d.__r = (rep)tVar5.__d.__r;
      (__return_storage_ptr__->trans).__d.__r = (__return_storage_ptr__->post).__d.__r;
      (__return_storage_ptr__->pre).__d.__r = (__return_storage_ptr__->trans).__d.__r;
    }
    else {
      limit.__d.__r = (duration)(local_20 * 0x2f0605980);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_38,(long *)&limit);
      __range4 = (initializer_list<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_*>
                  *)std::chrono::
                    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                    ::max();
      local_48 = std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                             *)&__range4,&local_38);
      __begin4 = (const_iterator)&__return_storage_ptr__->pre;
      local_78 = &__return_storage_ptr__->trans;
      local_70 = &__return_storage_ptr__->post;
      local_68._M_array = (iterator)&__begin4;
      local_68._M_len = 3;
      local_58 = &local_68;
      __end4 = std::
               initializer_list<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_*>
               ::begin(local_58);
      pptVar6 = std::
                initializer_list<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_*>
                ::end(local_58);
      for (; __end4 != pptVar6; __end4 = __end4 + 1) {
        __lhs = *__end4;
        bVar2 = std::chrono::operator>(__lhs,&local_48);
        if (bVar2) {
          tVar5 = std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                  ::max();
          (__lhs->__d).__r = (rep)tVar5.__d.__r;
        }
        else {
          std::chrono::
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
          ::operator+=(__lhs,&local_38);
        }
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("last_year_ - 400 < cs.year() && cs.year() <= last_year_",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                ,0x360,
                "time_zone::civil_lookup absl::time_internal::cctz::TimeZoneInfo::TimeLocal(const civil_second &, year_t) const"
               );
}

Assistant:

time_zone::civil_lookup TimeZoneInfo::TimeLocal(const civil_second& cs,
                                                year_t c4_shift) const {
  assert(last_year_ - 400 < cs.year() && cs.year() <= last_year_);
  time_zone::civil_lookup cl = MakeTime(cs);
  if (c4_shift > seconds::max().count() / kSecsPer400Years) {
    cl.pre = cl.trans = cl.post = time_point<seconds>::max();
  } else {
    const auto offset = seconds(c4_shift * kSecsPer400Years);
    const auto limit = time_point<seconds>::max() - offset;
    for (auto* tp : {&cl.pre, &cl.trans, &cl.post}) {
      if (*tp > limit) {
        *tp = time_point<seconds>::max();
      } else {
        *tp += offset;
      }
    }
  }
  return cl;
}